

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

string * __thiscall
util::str<char[27],char[87],char[2],int,char[3],std::__cxx11::string>
          (string *__return_storage_ptr__,util *this,char (*args) [27],char (*args_1) [87],
          char (*args_2) [2],int *args_3,char (*args_4) [3],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_5)

{
  ostringstream ss;
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  detail::_str<char[27],char[87],char[2],int,char[3],std::__cxx11::string>
            ((ostream *)local_1a8,(char (*) [27])this,(char (*) [87])args,(char (*) [2])args_1,
             (int *)args_2,(char (*) [3])args_3,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_4);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

inline std::string str(const Args&... args) {
  std::ostringstream ss;
  detail::_str(ss, args...);
  return ss.str();
}